

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_initialize_test.cpp
# Opt level: O0

void __thiscall
metacall_initialize_test_DefaultConstructor_Test::TestBody
          (metacall_initialize_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  char *in_stack_ffffffffffffff78;
  AssertHelper local_70;
  Message local_68;
  undefined4 local_60;
  undefined4 local_5c;
  AssertionResult local_58;
  uint local_44;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  metacall_print_info();
  local_1c = 0;
  local_20 = metacall_initialize();
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffff78,
             (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    in_stack_ffffffffffffff78 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10a9a9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_initialize_test/source/metacall_initialize_test.cpp"
               ,0x23,in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x10a9f7);
  }
  local_44 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10aa53);
  if (local_44 == 0) {
    local_5c = 1;
    local_60 = metacall_is_initialized("mock");
    this_00 = &local_58;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_ffffffffffffff78,
               (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),(int *)this_00,
               in_stack_ffffffffffffff60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!bVar1) {
      testing::Message::Message(&local_68);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x10aafe);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_initialize_test/source/metacall_initialize_test.cpp"
                 ,0x25,message);
      testing::internal::AssertHelper::operator=(&local_70,&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::Message::~Message((Message *)0x10ab4c);
    }
    local_44 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10aba2);
    if (local_44 == 0) {
      metacall_destroy();
    }
  }
  return;
}

Assistant:

TEST_F(metacall_initialize_test, DefaultConstructor)
{
	metacall_print_info();

	ASSERT_EQ((int)0, (int)metacall_initialize());

	ASSERT_EQ((int)1, (int)metacall_is_initialized("mock"));

/* Mock */
#if defined(OPTION_BUILD_LOADERS_MOCK)
	{
		const char *mock_scripts[] = {
			"empty.mock"
		};

		EXPECT_EQ((int)0, (int)metacall_load_from_file("mock", mock_scripts, sizeof(mock_scripts) / sizeof(mock_scripts[0]), NULL));

		ASSERT_EQ((int)0, (int)metacall_is_initialized("mock"));
	}
#endif /* OPTION_BUILD_LOADERS_MOCK */

	metacall_destroy();
}